

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O0

void __thiscall
Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::operator()
          (Preprocess *this,
          Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
          *p)

{
  SymbolId v;
  SymbolId v_00;
  bool bVar1;
  int iVar2;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_RSI;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *in_RDI;
  Elem var;
  StlIter __end0_1;
  StlIter __begin0_1;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
  *__range5;
  int cur;
  IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
  vars;
  VariableRegion varStack;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  varIter2;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  varIter;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> summand;
  StlIter __end0;
  StlIter __begin0;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *__range3;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  int in_stack_fffffffffffffd60;
  uint in_stack_fffffffffffffd64;
  Elem in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd80;
  int iVar3;
  Elem in_stack_fffffffffffffda0;
  Elem in_stack_fffffffffffffda4;
  VariableRegion *in_stack_fffffffffffffdb0;
  VariableRegion *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Preprocess *in_stack_fffffffffffffdd8;
  int local_1e0;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  local_1d8;
  IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
  local_198 [2];
  undefined1 local_118 [64];
  undefined1 local_d8 [32];
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  local_b8 [2];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_68 [3];
  undefined1 local_38 [32];
  undefined1 *local_18;
  
  Lib::
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::operator->(in_RSI);
  Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::iterSummands
            ((Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  local_18 = local_38;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
           *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
         *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
  while (bVar1 = Lib::operator!=((StlIter *)
                                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                 (StlIter *)
                                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58)),
        bVar1) {
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
    ::StlIter::operator*((StlIter *)0x74346b);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom
              (in_stack_fffffffffffffd70,
               (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68._num));
    Lib::
    Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
    ::operator->(local_68);
    Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::iter
              ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>>
    ::operator()(local_b8,local_d8);
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>)#1},false>>
    ::operator()((IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
                  *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>_>
                  *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>)#1},false>>
    ::operator()(local_198,local_118);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
    ::collect<Lib::Stack>
              ((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:137:18),_Inferences::AnyNumber<Kernel::MonomFactor>_>_>
                *)in_RDI);
    VariableRegion::VariableRegion
              ((VariableRegion *)
               CONCAT44(in_stack_fffffffffffffda4._num,in_stack_fffffffffffffda0._num),in_RDI);
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)
               CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    Lib::
    IterTraits<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>const&>,Inferences::VariableMultiplicationGeneralizationImpl::Preprocess::TEMPNAMEPLACEHOLDERVALUE(Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>)::{lambda(Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>)#1},false>>
    ::operator()(&local_1d8,local_b8);
    bVar1 = Lib::
            IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
            ::hasNext((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
                       *)0x74353e);
    if (bVar1) {
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::next((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
              *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      v.kind = in_stack_fffffffffffffd68._num;
      v.functor = in_stack_fffffffffffffd64;
      local_1e0 = root((Preprocess *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),v
                      );
      iVar3 = local_1e0;
      varSet((Preprocess *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             in_stack_fffffffffffffd5c);
      VariableRegion::VariableRegion
                ((VariableRegion *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (VariableRegion *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      VariableRegion::meet(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      in_stack_fffffffffffffd70 =
           (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
           varSet((Preprocess *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                  in_stack_fffffffffffffd5c);
      VariableRegion::operator=
                ((VariableRegion *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                 (VariableRegion *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      VariableRegion::~VariableRegion((VariableRegion *)0x74360f);
      VariableRegion::~VariableRegion((VariableRegion *)0x743619);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::begin((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
               *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::end((IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:132:21),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:140:31),_Kernel::Variable>_>
             *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      while( true ) {
        bVar1 = Lib::operator()((StlIter *)
                                CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                                (StlIter *)
                                CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        in_stack_fffffffffffffd6c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd6c);
        if (!bVar1) break;
        in_stack_fffffffffffffd68 =
             Lib::
             IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
             ::StlIter::operator*
                       ((StlIter *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
        v_00.kind = in_stack_fffffffffffffd68._num;
        v_00.functor = in_stack_fffffffffffffd64;
        in_stack_fffffffffffffda0 = in_stack_fffffffffffffd68;
        in_stack_fffffffffffffda4 = in_stack_fffffffffffffd68;
        in_stack_fffffffffffffd64 =
             root((Preprocess *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),v_00);
        iVar2 = joinRegions(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                            in_stack_fffffffffffffdd0);
        in_stack_fffffffffffffd5c = iVar2;
        Lib::
        IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
        ::StlIter::operator++((StlIter *)CONCAT44(iVar3,in_stack_fffffffffffffd80));
        in_stack_fffffffffffffd60 = local_1e0;
        local_1e0 = iVar2;
      }
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::StlIter::~StlIter((StlIter *)0x743677);
      Lib::
      IterTraits<Lib::MappingIterator<Lib::FilteredIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:132:21),_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:140:31),_Kernel::Variable>_>
      ::StlIter::~StlIter((StlIter *)0x743681);
    }
    VariableRegion::~VariableRegion((VariableRegion *)0x7437eb);
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::~Monom
              ((Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x7437f8);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>
    ::StlIter::operator++((StlIter *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  }
  return;
}

Assistant:

void operator()(Perfect<Polynom<NumTraits>> p) 
  {
    for (auto summand : p->iterSummands()) {

      auto varIter = summand.factors->iter()
            .filter([](MonomFactor<NumTraits> factor) { return factor.term.template is<Variable>(); });

      auto varIter2 = varIter;
      auto varStack = VariableRegion(
          varIter2
            .map([](MonomFactor<NumTraits> factor) { return AnyNumber<MonomFactor>(factor); })
            .template collect<Stack>());

      auto vars = varIter.map([](MonomFactor<NumTraits> factor) { return factor.term.template unwrap<Variable>(); });

      if (vars.hasNext())  {
        auto cur = root(vars.next());

        varSet(cur) = std::move(varSet(cur)).meet(std::move(varStack));

        for (auto var : vars) {
          cur = joinRegions(cur, root(var));
        }

      }
    }
  }